

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  UWORD8 *pUVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 uVar6;
  undefined1 uVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  uint6 uVar15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  UWORD8 aUVar20 [16];
  long lVar21;
  UWORD8 *pUVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar51;
  undefined4 uVar50;
  short sVar52;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  short sVar53;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined4 uVar67;
  short sVar86;
  short sVar87;
  undefined1 auVar68 [16];
  short sVar85;
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar94;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined4 uVar95;
  undefined4 uVar98;
  undefined1 in_XMM5 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  short sVar109;
  undefined1 in_XMM9 [16];
  short sVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  short local_78;
  short sStack_76;
  undefined1 auVar37 [16];
  undefined1 auVar44 [16];
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  undefined1 auVar39 [16];
  undefined1 auVar46 [16];
  undefined1 auVar58 [16];
  undefined1 auVar64 [16];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar83 [16];
  undefined1 auVar72 [16];
  undefined1 auVar84 [16];
  undefined1 auVar73 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  
  aUVar20 = IHEVCE_SHUFFLEMASKY7;
  auVar34 = _DAT_00172390;
  auVar33 = pshuflw(ZEXT416((uint)gai4_ihevc_ang_table[mode]),
                    ZEXT416((uint)gai4_ihevc_ang_table[mode]),0);
  auVar74._0_2_ = auVar33._0_2_;
  sVar85 = auVar33._2_2_;
  if (nt == 4) {
    auVar74._2_2_ = sVar85 * 2;
    auVar74._4_2_ = auVar74._0_2_ * 3;
    auVar74._6_2_ = sVar85 * 4;
    auVar74._8_2_ = auVar74._0_2_ * 5;
    auVar74._10_2_ = sVar85 * 6;
    auVar74._12_2_ = auVar74._0_2_ * 7;
    auVar74._14_2_ = sVar85 * 8;
    auVar54 = pmovsxbw(in_XMM2,0x1c1f1e1f1c1f1e1f);
    auVar54 = auVar54 & auVar74;
    auVar68 = psraw(auVar74,4);
    auVar68 = auVar68 & _DAT_001723a0;
    auVar34 = pmovsxbw(auVar33,0xe0e0e0e0e0e0e0e);
    auVar33 = pmovsxbw(auVar68,0x2020202020202020);
    auVar70._0_2_ = auVar33._0_2_ - auVar54._0_2_;
    sVar85 = auVar33._2_2_ - auVar54._2_2_;
    sVar86 = auVar33._4_2_ - auVar54._4_2_;
    sVar87 = auVar33._6_2_ - auVar54._6_2_;
    uVar8 = CONCAT22(auVar33._8_2_ - auVar54._8_2_,sVar87);
    auVar71._0_9_ = (unkuint9)uVar8 << 0x30;
    uVar15 = CONCAT24(auVar33._10_2_ - auVar54._10_2_,uVar8);
    auVar16._6_5_ = 0;
    auVar16._0_6_ = uVar15;
    auVar72._0_11_ = auVar16 << 0x30;
    uVar27 = CONCAT26(auVar33._12_2_ - auVar54._12_2_,uVar15);
    auVar18._8_5_ = 0;
    auVar18._0_8_ = uVar27;
    auVar73._0_13_ = auVar18 << 0x30;
    uVar6 = (undefined1)sVar85;
    uVar7 = (undefined1)sVar86;
    auVar73._14_2_ =
         (undefined2)(CONCAT19(auVar54[7],CONCAT18((char)((ushort)sVar87 >> 8),uVar27)) >> 0x40);
    auVar73[0xd] = auVar54[6];
    auVar72._12_4_ = (undefined4)(CONCAT37(auVar73._13_3_,CONCAT16((char)sVar87,uVar15)) >> 0x30);
    auVar72[0xb] = auVar54[5];
    auVar71._10_6_ =
         (undefined6)(CONCAT55(auVar72._11_5_,CONCAT14((char)((ushort)sVar86 >> 8),uVar8)) >> 0x20);
    auVar71[9] = auVar54[4];
    auVar70._8_8_ = (undefined8)(CONCAT73(auVar71._9_7_,CONCAT12(uVar7,sVar87)) >> 0x10);
    auVar70[7] = auVar54[3];
    auVar70[6] = (char)((ushort)sVar85 >> 8);
    auVar70[5] = auVar54[2];
    auVar70[4] = uVar6;
    auVar70[3] = auVar54[1];
    auVar70[2] = (char)((ushort)auVar70._0_2_ >> 8);
    auVar69._2_14_ = auVar70._2_14_;
    auVar69[0] = (undefined1)auVar70._0_2_;
    auVar69[1] = auVar54[0];
    auVar33 = pshuflw(auVar54,auVar69,0);
    uVar50 = auVar33._0_4_;
    auVar108._4_4_ = uVar50;
    auVar108._0_4_ = uVar50;
    auVar108._8_4_ = uVar50;
    auVar108._12_4_ = uVar50;
    auVar33 = pshuflw(auVar33,ZEXT216(CONCAT11(auVar54[2],uVar6)),0);
    uVar50 = auVar33._0_4_;
    auVar107._4_4_ = uVar50;
    auVar107._0_4_ = uVar50;
    auVar107._8_4_ = uVar50;
    auVar107._12_4_ = uVar50;
    auVar33 = pshuflw(auVar33,ZEXT216(CONCAT11(auVar54[4],uVar7)),0);
    uVar50 = auVar33._0_4_;
    auVar99._4_4_ = uVar50;
    auVar99._0_4_ = uVar50;
    auVar99._8_4_ = uVar50;
    auVar99._12_4_ = uVar50;
    auVar33 = pshuflw(auVar33,ZEXT216(CONCAT11(auVar54[6],(char)sVar87)),0);
    uVar50 = auVar33._0_4_;
    auVar96._4_4_ = uVar50;
    auVar96._0_4_ = uVar50;
    auVar96._8_4_ = uVar50;
    auVar96._12_4_ = uVar50;
    auVar33 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar34._0_2_ - auVar68._0_2_) + -8),_DAT_00172390);
    auVar33 = pmaddubsw(auVar33,auVar108);
    auVar74 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar34._2_2_ - auVar68._2_2_) + -8),_DAT_00172390);
    auVar54 = pmaddubsw(auVar74,auVar107);
    auVar74 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar34._4_2_ - auVar68._4_2_) + -8),_DAT_00172390);
    auVar74 = pmaddubsw(auVar74,auVar99);
    auVar34 = pshufb(*(undefined1 (*) [16])
                      (pu1_ref + (long)(short)(auVar34._6_2_ - auVar68._6_2_) + -8),_DAT_00172390);
    auVar34 = pmaddubsw(auVar34,auVar96);
    auVar68 = pmovsxbw(auVar96,0x1010101010101010);
    sVar85 = auVar68._0_2_;
    auVar35._0_2_ = auVar33._0_2_ + sVar85;
    sVar86 = auVar68._2_2_;
    auVar35._2_2_ = auVar33._2_2_ + sVar86;
    sVar87 = auVar68._4_2_;
    auVar35._4_2_ = auVar33._4_2_ + sVar87;
    sVar47 = auVar68._6_2_;
    auVar35._6_2_ = auVar33._6_2_ + sVar47;
    sVar48 = auVar68._8_2_;
    auVar35._8_2_ = auVar33._8_2_ + sVar48;
    sVar49 = auVar68._10_2_;
    auVar35._10_2_ = auVar33._10_2_ + sVar49;
    sVar51 = auVar68._12_2_;
    auVar35._12_2_ = auVar33._12_2_ + sVar51;
    sVar52 = auVar68._14_2_;
    auVar35._14_2_ = auVar33._14_2_ + sVar52;
    auVar75._0_2_ = auVar54._0_2_ + sVar85;
    auVar75._2_2_ = auVar54._2_2_ + sVar86;
    auVar75._4_2_ = auVar54._4_2_ + sVar87;
    auVar75._6_2_ = auVar54._6_2_ + sVar47;
    auVar75._8_2_ = auVar54._8_2_ + sVar48;
    auVar75._10_2_ = auVar54._10_2_ + sVar49;
    auVar75._12_2_ = auVar54._12_2_ + sVar51;
    auVar75._14_2_ = auVar54._14_2_ + sVar52;
    auVar55._0_2_ = auVar74._0_2_ + sVar85;
    auVar55._2_2_ = auVar74._2_2_ + sVar86;
    auVar55._4_2_ = auVar74._4_2_ + sVar87;
    auVar55._6_2_ = auVar74._6_2_ + sVar47;
    auVar55._8_2_ = auVar74._8_2_ + sVar48;
    auVar55._10_2_ = auVar74._10_2_ + sVar49;
    auVar55._12_2_ = auVar74._12_2_ + sVar51;
    auVar55._14_2_ = auVar74._14_2_ + sVar52;
    auVar88._0_2_ = auVar34._0_2_ + sVar85;
    auVar88._2_2_ = auVar34._2_2_ + sVar86;
    auVar88._4_2_ = auVar34._4_2_ + sVar87;
    auVar88._6_2_ = auVar34._6_2_ + sVar47;
    auVar88._8_2_ = auVar34._8_2_ + sVar48;
    auVar88._10_2_ = auVar34._10_2_ + sVar49;
    auVar88._12_2_ = auVar34._12_2_ + sVar51;
    auVar88._14_2_ = auVar34._14_2_ + sVar52;
    auVar34 = psraw(auVar35,5);
    auVar54 = psraw(auVar75,5);
    auVar74 = psraw(auVar55,5);
    auVar68 = psraw(auVar88,5);
    sVar85 = auVar34._0_2_;
    sVar86 = auVar34._2_2_;
    auVar33[1] = (0 < sVar86) * (sVar86 < 0x100) * auVar34[2] - (0xff < sVar86);
    auVar33[0] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[0] - (0xff < sVar85);
    sVar85 = auVar34._4_2_;
    auVar33[2] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[4] - (0xff < sVar85);
    sVar85 = auVar34._6_2_;
    auVar33[3] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[6] - (0xff < sVar85);
    sVar85 = auVar34._8_2_;
    auVar33[4] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[8] - (0xff < sVar85);
    sVar85 = auVar34._10_2_;
    auVar33[5] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[10] - (0xff < sVar85);
    sVar85 = auVar34._12_2_;
    auVar33[6] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[0xc] - (0xff < sVar85);
    sVar85 = auVar34._14_2_;
    auVar33[7] = (0 < sVar85) * (sVar85 < 0x100) * auVar34[0xe] - (0xff < sVar85);
    auVar33._8_8_ = 0;
    sVar85 = auVar54._0_2_;
    sVar86 = auVar54._2_2_;
    auVar76[1] = (0 < sVar86) * (sVar86 < 0x100) * auVar54[2] - (0xff < sVar86);
    auVar76[0] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[0] - (0xff < sVar85);
    sVar85 = auVar54._4_2_;
    auVar76[2] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[4] - (0xff < sVar85);
    sVar85 = auVar54._6_2_;
    auVar76[3] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[6] - (0xff < sVar85);
    sVar85 = auVar54._8_2_;
    auVar76[4] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[8] - (0xff < sVar85);
    sVar85 = auVar54._10_2_;
    auVar76[5] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[10] - (0xff < sVar85);
    sVar85 = auVar54._12_2_;
    auVar76[6] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[0xc] - (0xff < sVar85);
    sVar85 = auVar54._14_2_;
    auVar76[7] = (0 < sVar85) * (sVar85 < 0x100) * auVar54[0xe] - (0xff < sVar85);
    auVar76._8_8_ = 0;
    sVar85 = auVar74._0_2_;
    sVar86 = auVar74._2_2_;
    auVar56[1] = (0 < sVar86) * (sVar86 < 0x100) * auVar74[2] - (0xff < sVar86);
    auVar56[0] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[0] - (0xff < sVar85);
    sVar85 = auVar74._4_2_;
    auVar56[2] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[4] - (0xff < sVar85);
    sVar85 = auVar74._6_2_;
    auVar56[3] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[6] - (0xff < sVar85);
    sVar85 = auVar74._8_2_;
    auVar56[4] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[8] - (0xff < sVar85);
    sVar85 = auVar74._10_2_;
    auVar56[5] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[10] - (0xff < sVar85);
    sVar85 = auVar74._12_2_;
    auVar56[6] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[0xc] - (0xff < sVar85);
    sVar85 = auVar74._14_2_;
    auVar56[7] = (0 < sVar85) * (sVar85 < 0x100) * auVar74[0xe] - (0xff < sVar85);
    auVar56._8_8_ = 0;
    sVar85 = auVar68._0_2_;
    sVar86 = auVar68._2_2_;
    auVar89[1] = (0 < sVar86) * (sVar86 < 0x100) * auVar68[2] - (0xff < sVar86);
    auVar89[0] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[0] - (0xff < sVar85);
    sVar85 = auVar68._4_2_;
    auVar89[2] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[4] - (0xff < sVar85);
    sVar85 = auVar68._6_2_;
    auVar89[3] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[6] - (0xff < sVar85);
    sVar85 = auVar68._8_2_;
    auVar89[4] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[8] - (0xff < sVar85);
    sVar85 = auVar68._10_2_;
    auVar89[5] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[10] - (0xff < sVar85);
    sVar85 = auVar68._12_2_;
    auVar89[6] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[0xc] - (0xff < sVar85);
    sVar85 = auVar68._14_2_;
    auVar89[7] = (0 < sVar85) * (sVar85 < 0x100) * auVar68[0xe] - (0xff < sVar85);
    auVar89._8_8_ = 0;
    auVar34 = pshufb(auVar33,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar33 = pshufb(auVar76,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar39._0_12_ = auVar34._0_12_;
    auVar39._12_2_ = auVar34._6_2_;
    auVar39._14_2_ = auVar33._6_2_;
    auVar38._12_4_ = auVar39._12_4_;
    auVar38._0_10_ = auVar34._0_10_;
    auVar38._10_2_ = auVar33._4_2_;
    auVar37._10_6_ = auVar38._10_6_;
    auVar37._0_8_ = auVar34._0_8_;
    auVar37._8_2_ = auVar34._4_2_;
    auVar9._4_8_ = auVar37._8_8_;
    auVar9._2_2_ = auVar33._2_2_;
    auVar9._0_2_ = auVar34._2_2_;
    auVar36._0_4_ = CONCAT22(auVar33._0_2_,auVar34._0_2_);
    auVar36._4_12_ = auVar9;
    auVar33 = pshufb(auVar56,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar74 = pshufb(auVar89,(undefined1  [16])IHEVCE_SHUFFLEMASKY7);
    auVar59._0_12_ = auVar33._0_12_;
    auVar59._12_2_ = auVar33._6_2_;
    auVar59._14_2_ = auVar74._6_2_;
    auVar58._12_4_ = auVar59._12_4_;
    auVar58._0_10_ = auVar33._0_10_;
    auVar58._10_2_ = auVar74._4_2_;
    auVar57._10_6_ = auVar58._10_6_;
    auVar57._0_8_ = auVar33._0_8_;
    auVar57._8_2_ = auVar33._4_2_;
    auVar10._4_8_ = auVar57._8_8_;
    auVar10._2_2_ = auVar74._2_2_;
    auVar10._0_2_ = auVar33._2_2_;
    auVar34._0_8_ = auVar36._0_8_;
    auVar34._8_4_ = auVar9._0_4_;
    auVar34._12_4_ = auVar10._0_4_;
    *(ulong *)pu1_dst = CONCAT44(CONCAT22(auVar74._0_2_,auVar33._0_2_),auVar36._0_4_);
    lVar21 = (long)dst_strd;
    *(long *)(pu1_dst + lVar21) = auVar34._8_8_;
    *(int *)(pu1_dst + lVar21 * 2) = auVar37._8_4_;
    *(int *)(pu1_dst + lVar21 * 2 + 4) = auVar57._8_4_;
    *(undefined4 *)(pu1_dst + lVar21 * 3 + 8) = auVar38._12_4_;
    *(undefined4 *)(pu1_dst + lVar21 * 3 + 0xc) = auVar58._12_4_;
  }
  else if (0 < nt) {
    auVar33 = ZEXT416(nt * 4 - 2);
    auVar33 = pshuflw(auVar33,auVar33,0);
    auVar54._0_4_ = auVar33._0_4_;
    auVar54._4_4_ = auVar54._0_4_;
    auVar54._8_4_ = auVar54._0_4_;
    auVar54._12_4_ = auVar54._0_4_;
    lVar21 = (long)dst_strd;
    auVar68 = pmovsxbw(auVar54,0x807060504030201);
    uVar27 = 0;
    auVar54 = pmovsxbw(in_XMM9,0x1010101010101010);
    do {
      auVar60._0_2_ = auVar68._0_2_ * auVar74._0_2_;
      sVar86 = auVar68._2_2_;
      auVar60._2_2_ = sVar86 * sVar85;
      sVar87 = auVar68._4_2_;
      auVar60._4_2_ = sVar87 * auVar74._0_2_;
      sVar47 = auVar68._6_2_;
      auVar60._6_2_ = sVar47 * sVar85;
      sVar48 = auVar68._8_2_;
      auVar60._8_2_ = sVar48 * auVar74._0_2_;
      sVar49 = auVar68._10_2_;
      auVar60._10_2_ = sVar49 * sVar85;
      sVar51 = auVar68._12_2_;
      sVar52 = auVar68._14_2_;
      auVar60._12_2_ = sVar51 * auVar74._0_2_;
      auVar60._14_2_ = sVar52 * sVar85;
      auVar77 = auVar60 & _DAT_00172230;
      auVar68._0_2_ = auVar68._0_2_ + 8;
      auVar68._2_2_ = sVar86 + 8;
      auVar68._4_2_ = sVar87 + 8;
      auVar68._6_2_ = sVar47 + 8;
      auVar68._8_2_ = sVar48 + 8;
      auVar68._10_2_ = sVar49 + 8;
      auVar68._12_2_ = sVar51 + 8;
      auVar68._14_2_ = sVar52 + 8;
      auVar40 = pmovsxbw(auVar68,0x2020202020202020);
      sVar86 = auVar40._0_2_ - auVar77._0_2_;
      sVar87 = auVar40._2_2_ - auVar77._2_2_;
      sVar47 = auVar40._4_2_ - auVar77._4_2_;
      sVar48 = auVar40._6_2_ - auVar77._6_2_;
      sVar49 = auVar40._8_2_ - auVar77._8_2_;
      uVar8 = CONCAT22(sVar49,sVar48);
      auVar91._0_9_ = (unkuint9)uVar8 << 0x30;
      sVar51 = auVar40._10_2_ - auVar77._10_2_;
      uVar15 = CONCAT24(sVar51,uVar8);
      auVar17._6_5_ = 0;
      auVar17._0_6_ = uVar15;
      auVar92._0_11_ = auVar17 << 0x30;
      sVar52 = auVar40._12_2_ - auVar77._12_2_;
      auVar19._8_5_ = 0;
      auVar19._0_8_ = CONCAT26(sVar52,uVar15);
      auVar111._0_13_ = auVar19 << 0x30;
      sVar53 = auVar40._14_2_ - auVar77._14_2_;
      auVar111._14_2_ =
           (undefined2)
           (CONCAT19(auVar77[7],CONCAT18((char)((ushort)sVar48 >> 8),CONCAT26(sVar52,uVar15))) >>
           0x40);
      auVar111[0xd] = auVar77[6];
      auVar92._12_4_ = (undefined4)(CONCAT37(auVar111._13_3_,CONCAT16((char)sVar48,uVar15)) >> 0x30)
      ;
      auVar92[0xb] = auVar77[5];
      auVar91._10_6_ =
           (undefined6)
           (CONCAT55(auVar92._11_5_,CONCAT14((char)((ushort)sVar47 >> 8),uVar8)) >> 0x20);
      auVar91[9] = auVar77[4];
      auVar90._8_8_ = (undefined8)(CONCAT73(auVar91._9_7_,CONCAT12((char)sVar47,sVar48)) >> 0x10);
      auVar90[7] = auVar77[3];
      auVar90[6] = (char)((ushort)sVar87 >> 8);
      auVar90[5] = auVar77[2];
      auVar90[4] = (char)sVar87;
      auVar90[3] = auVar77[1];
      auVar90[2] = (char)((ushort)sVar86 >> 8);
      auVar90._0_2_ = sVar86;
      auVar100._2_14_ = auVar90._2_14_;
      auVar100[0] = (undefined1)sVar86;
      auVar100[1] = auVar77[0];
      auVar40 = pshuflw(in_XMM5,auVar100,0);
      auVar97._0_4_ = auVar40._0_4_;
      auVar97._4_4_ = auVar97._0_4_;
      auVar97._8_4_ = auVar97._0_4_;
      auVar97._12_4_ = auVar97._0_4_;
      auVar40 = pshuflw(auVar97,auVar100,0xaa);
      uVar95 = auVar40._0_4_;
      auVar40 = pshufhw(auVar40,auVar100,0);
      uVar98 = auVar40._8_4_;
      auVar40 = pshufhw(auVar100,auVar100,0xaa);
      uVar94 = auVar40._8_4_;
      auVar40[1] = auVar77[8];
      auVar40[0] = (char)sVar49;
      auVar40[2] = (char)((ushort)sVar49 >> 8);
      auVar40[3] = auVar77[9];
      auVar40[4] = (char)sVar51;
      auVar40[5] = auVar77[10];
      auVar40[6] = (char)((ushort)sVar51 >> 8);
      auVar40[7] = auVar77[0xb];
      auVar40[8] = (char)sVar52;
      auVar40[9] = auVar77[0xc];
      auVar40[10] = (char)((ushort)sVar52 >> 8);
      auVar40[0xb] = auVar77[0xd];
      auVar40[0xc] = (char)sVar53;
      auVar40[0xd] = auVar77[0xe];
      auVar40[0xe] = (char)((ushort)sVar53 >> 8);
      auVar40[0xf] = auVar77[0xf];
      auVar77 = pshuflw(auVar77,auVar40,0);
      uVar67 = auVar77._0_4_;
      auVar60 = psraw(auVar60,4);
      auVar60 = auVar60 & _DAT_00172380;
      local_78 = auVar33._0_2_;
      sStack_76 = auVar33._2_2_;
      auVar77 = pshuflw(auVar60,auVar40,0xaa);
      uVar50 = auVar77._0_4_;
      auVar93._4_4_ = uVar50;
      auVar93._0_4_ = uVar50;
      auVar93._8_4_ = uVar50;
      auVar93._12_4_ = uVar50;
      auVar77 = pshufhw(auVar77,auVar40,0);
      uVar50 = auVar77._8_4_;
      in_XMM5._4_4_ = uVar50;
      in_XMM5._0_4_ = uVar50;
      in_XMM5._8_4_ = uVar50;
      in_XMM5._12_4_ = uVar50;
      auVar40 = pshufhw(auVar40,auVar40,0xaa);
      uVar50 = auVar40._8_4_;
      auVar77._4_4_ = uVar50;
      auVar77._0_4_ = uVar50;
      auVar77._8_4_ = uVar50;
      auVar77._12_4_ = uVar50;
      lVar28 = (long)(short)(local_78 - auVar60._0_2_);
      lVar23 = (long)(short)(sStack_76 - auVar60._2_2_);
      lVar31 = (long)(short)(local_78 - auVar60._4_2_);
      lVar32 = (long)(short)(sStack_76 - auVar60._6_2_);
      lVar29 = (long)(short)(local_78 - auVar60._8_2_);
      lVar30 = (long)(short)(sStack_76 - auVar60._10_2_);
      lVar24 = (long)(short)(local_78 - auVar60._12_2_);
      lVar26 = (long)(short)(sStack_76 - auVar60._14_2_);
      uVar25 = 0;
      pUVar22 = pu1_dst;
      do {
        lVar32 = lVar32 + -8;
        lVar31 = lVar31 + -8;
        lVar30 = lVar30 + -8;
        lVar29 = lVar29 + -8;
        lVar28 = lVar28 + -8;
        lVar26 = lVar26 + -8;
        lVar24 = lVar24 + -8;
        lVar23 = lVar23 + -8;
        auVar40 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar28),auVar34);
        auVar100 = pmaddubsw(auVar40,auVar97);
        auVar40 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar23),auVar34);
        auVar2._4_4_ = uVar95;
        auVar2._0_4_ = uVar95;
        auVar2._8_4_ = uVar95;
        auVar2._12_4_ = uVar95;
        auVar111 = pmaddubsw(auVar40,auVar2);
        auVar40 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar31),auVar34);
        auVar3._4_4_ = uVar98;
        auVar3._0_4_ = uVar98;
        auVar3._8_4_ = uVar98;
        auVar3._12_4_ = uVar98;
        auVar40 = pmaddubsw(auVar40,auVar3);
        auVar60 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar32),auVar34);
        auVar4._4_4_ = uVar94;
        auVar4._0_4_ = uVar94;
        auVar4._8_4_ = uVar94;
        auVar4._12_4_ = uVar94;
        auVar60 = pmaddubsw(auVar60,auVar4);
        sVar47 = auVar54._0_2_;
        auVar101._0_2_ = auVar100._0_2_ + sVar47;
        sVar48 = auVar54._2_2_;
        auVar101._2_2_ = auVar100._2_2_ + sVar48;
        sVar49 = auVar54._4_2_;
        auVar101._4_2_ = auVar100._4_2_ + sVar49;
        sVar51 = auVar54._6_2_;
        auVar101._6_2_ = auVar100._6_2_ + sVar51;
        sVar52 = auVar54._8_2_;
        auVar101._8_2_ = auVar100._8_2_ + sVar52;
        sVar53 = auVar54._10_2_;
        auVar101._10_2_ = auVar100._10_2_ + sVar53;
        sVar109 = auVar54._12_2_;
        auVar101._12_2_ = auVar100._12_2_ + sVar109;
        sVar110 = auVar54._14_2_;
        auVar101._14_2_ = auVar100._14_2_ + sVar110;
        auVar112._0_2_ = auVar111._0_2_ + sVar47;
        auVar112._2_2_ = auVar111._2_2_ + sVar48;
        auVar112._4_2_ = auVar111._4_2_ + sVar49;
        auVar112._6_2_ = auVar111._6_2_ + sVar51;
        auVar112._8_2_ = auVar111._8_2_ + sVar52;
        auVar112._10_2_ = auVar111._10_2_ + sVar53;
        auVar112._12_2_ = auVar111._12_2_ + sVar109;
        auVar112._14_2_ = auVar111._14_2_ + sVar110;
        auVar100 = psraw(auVar101,5);
        auVar111 = psraw(auVar112,5);
        sVar86 = auVar100._0_2_;
        sVar87 = auVar100._2_2_;
        auVar102[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar100[2] - (0xff < sVar87);
        auVar102[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[0] - (0xff < sVar86);
        sVar86 = auVar100._4_2_;
        auVar102[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[4] - (0xff < sVar86);
        sVar86 = auVar100._6_2_;
        auVar102[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[6] - (0xff < sVar86);
        sVar86 = auVar100._8_2_;
        auVar102[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[8] - (0xff < sVar86);
        sVar86 = auVar100._10_2_;
        auVar102[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[10] - (0xff < sVar86);
        sVar86 = auVar100._12_2_;
        auVar102[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[0xc] - (0xff < sVar86);
        sVar86 = auVar100._14_2_;
        auVar102[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar100[0xe] - (0xff < sVar86);
        auVar102._8_8_ = 0;
        sVar86 = auVar111._0_2_;
        sVar87 = auVar111._2_2_;
        auVar113[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar111[2] - (0xff < sVar87);
        auVar113[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0] - (0xff < sVar86);
        sVar86 = auVar111._4_2_;
        auVar113[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[4] - (0xff < sVar86);
        sVar86 = auVar111._6_2_;
        auVar113[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[6] - (0xff < sVar86);
        sVar86 = auVar111._8_2_;
        auVar113[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[8] - (0xff < sVar86);
        sVar86 = auVar111._10_2_;
        auVar113[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[10] - (0xff < sVar86);
        sVar86 = auVar111._12_2_;
        auVar113[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xc] - (0xff < sVar86);
        sVar86 = auVar111._14_2_;
        auVar113[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xe] - (0xff < sVar86);
        auVar113._8_8_ = 0;
        auVar100 = pshufb(auVar102,(undefined1  [16])aUVar20);
        auVar111 = pshufb(auVar113,(undefined1  [16])aUVar20);
        auVar106._0_12_ = auVar100._0_12_;
        auVar106._12_2_ = auVar100._6_2_;
        auVar106._14_2_ = auVar111._6_2_;
        auVar105._12_4_ = auVar106._12_4_;
        auVar105._0_10_ = auVar100._0_10_;
        auVar105._10_2_ = auVar111._4_2_;
        auVar104._10_6_ = auVar105._10_6_;
        auVar104._0_8_ = auVar100._0_8_;
        auVar104._8_2_ = auVar100._4_2_;
        auVar11._4_8_ = auVar104._8_8_;
        auVar11._2_2_ = auVar111._2_2_;
        auVar11._0_2_ = auVar100._2_2_;
        auVar103._0_4_ = CONCAT22(auVar111._0_2_,auVar100._0_2_);
        auVar103._4_12_ = auVar11;
        auVar61._0_2_ = auVar40._0_2_ + sVar47;
        auVar61._2_2_ = auVar40._2_2_ + sVar48;
        auVar61._4_2_ = auVar40._4_2_ + sVar49;
        auVar61._6_2_ = auVar40._6_2_ + sVar51;
        auVar61._8_2_ = auVar40._8_2_ + sVar52;
        auVar61._10_2_ = auVar40._10_2_ + sVar53;
        auVar61._12_2_ = auVar40._12_2_ + sVar109;
        auVar61._14_2_ = auVar40._14_2_ + sVar110;
        auVar78._0_2_ = auVar60._0_2_ + sVar47;
        auVar78._2_2_ = auVar60._2_2_ + sVar48;
        auVar78._4_2_ = auVar60._4_2_ + sVar49;
        auVar78._6_2_ = auVar60._6_2_ + sVar51;
        auVar78._8_2_ = auVar60._8_2_ + sVar52;
        auVar78._10_2_ = auVar60._10_2_ + sVar53;
        auVar78._12_2_ = auVar60._12_2_ + sVar109;
        auVar78._14_2_ = auVar60._14_2_ + sVar110;
        auVar40 = psraw(auVar61,5);
        auVar60 = psraw(auVar78,5);
        sVar86 = auVar40._0_2_;
        sVar87 = auVar40._2_2_;
        auVar62[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar40[2] - (0xff < sVar87);
        auVar62[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0] - (0xff < sVar86);
        sVar86 = auVar40._4_2_;
        auVar62[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[4] - (0xff < sVar86);
        sVar86 = auVar40._6_2_;
        auVar62[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[6] - (0xff < sVar86);
        sVar86 = auVar40._8_2_;
        auVar62[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[8] - (0xff < sVar86);
        sVar86 = auVar40._10_2_;
        auVar62[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[10] - (0xff < sVar86);
        sVar86 = auVar40._12_2_;
        auVar62[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xc] - (0xff < sVar86);
        sVar86 = auVar40._14_2_;
        auVar62[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xe] - (0xff < sVar86);
        auVar62._8_8_ = 0;
        sVar86 = auVar60._0_2_;
        sVar87 = auVar60._2_2_;
        auVar79[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar60[2] - (0xff < sVar87);
        auVar79[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[0] - (0xff < sVar86);
        sVar86 = auVar60._4_2_;
        auVar79[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[4] - (0xff < sVar86);
        sVar86 = auVar60._6_2_;
        auVar79[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[6] - (0xff < sVar86);
        sVar86 = auVar60._8_2_;
        auVar79[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[8] - (0xff < sVar86);
        sVar86 = auVar60._10_2_;
        auVar79[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[10] - (0xff < sVar86);
        sVar86 = auVar60._12_2_;
        auVar79[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[0xc] - (0xff < sVar86);
        sVar86 = auVar60._14_2_;
        auVar79[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar60[0xe] - (0xff < sVar86);
        auVar79._8_8_ = 0;
        auVar60 = pshufb(auVar62,(undefined1  [16])aUVar20);
        auVar100 = pshufb(auVar79,(undefined1  [16])aUVar20);
        auVar65._0_12_ = auVar60._0_12_;
        auVar65._12_2_ = auVar60._6_2_;
        auVar65._14_2_ = auVar100._6_2_;
        auVar64._12_4_ = auVar65._12_4_;
        auVar64._0_10_ = auVar60._0_10_;
        auVar64._10_2_ = auVar100._4_2_;
        auVar63._10_6_ = auVar64._10_6_;
        auVar63._0_8_ = auVar60._0_8_;
        auVar63._8_2_ = auVar60._4_2_;
        auVar12._4_8_ = auVar63._8_8_;
        auVar12._2_2_ = auVar100._2_2_;
        auVar12._0_2_ = auVar60._2_2_;
        auVar40 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar29),auVar34);
        auVar5._4_4_ = uVar67;
        auVar5._0_4_ = uVar67;
        auVar5._8_4_ = uVar67;
        auVar5._12_4_ = uVar67;
        auVar40 = pmaddubsw(auVar40,auVar5);
        auVar111 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar30),auVar34);
        auVar111 = pmaddubsw(auVar111,auVar93);
        auVar41._0_2_ = auVar40._0_2_ + sVar47;
        auVar41._2_2_ = auVar40._2_2_ + sVar48;
        auVar41._4_2_ = auVar40._4_2_ + sVar49;
        auVar41._6_2_ = auVar40._6_2_ + sVar51;
        auVar41._8_2_ = auVar40._8_2_ + sVar52;
        auVar41._10_2_ = auVar40._10_2_ + sVar53;
        auVar41._12_2_ = auVar40._12_2_ + sVar109;
        auVar41._14_2_ = auVar40._14_2_ + sVar110;
        auVar114._0_2_ = auVar111._0_2_ + sVar47;
        auVar114._2_2_ = auVar111._2_2_ + sVar48;
        auVar114._4_2_ = auVar111._4_2_ + sVar49;
        auVar114._6_2_ = auVar111._6_2_ + sVar51;
        auVar114._8_2_ = auVar111._8_2_ + sVar52;
        auVar114._10_2_ = auVar111._10_2_ + sVar53;
        auVar114._12_2_ = auVar111._12_2_ + sVar109;
        auVar114._14_2_ = auVar111._14_2_ + sVar110;
        auVar40 = psraw(auVar41,5);
        auVar111 = psraw(auVar114,5);
        sVar86 = auVar40._0_2_;
        sVar87 = auVar40._2_2_;
        auVar42[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar40[2] - (0xff < sVar87);
        auVar42[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0] - (0xff < sVar86);
        sVar86 = auVar40._4_2_;
        auVar42[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[4] - (0xff < sVar86);
        sVar86 = auVar40._6_2_;
        auVar42[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[6] - (0xff < sVar86);
        sVar86 = auVar40._8_2_;
        auVar42[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[8] - (0xff < sVar86);
        sVar86 = auVar40._10_2_;
        auVar42[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[10] - (0xff < sVar86);
        sVar86 = auVar40._12_2_;
        auVar42[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xc] - (0xff < sVar86);
        sVar86 = auVar40._14_2_;
        auVar42[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xe] - (0xff < sVar86);
        auVar42._8_8_ = 0;
        sVar86 = auVar111._0_2_;
        sVar87 = auVar111._2_2_;
        auVar115[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar111[2] - (0xff < sVar87);
        auVar115[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0] - (0xff < sVar86);
        sVar86 = auVar111._4_2_;
        auVar115[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[4] - (0xff < sVar86);
        sVar86 = auVar111._6_2_;
        auVar115[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[6] - (0xff < sVar86);
        sVar86 = auVar111._8_2_;
        auVar115[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[8] - (0xff < sVar86);
        sVar86 = auVar111._10_2_;
        auVar115[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[10] - (0xff < sVar86);
        sVar86 = auVar111._12_2_;
        auVar115[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xc] - (0xff < sVar86);
        sVar86 = auVar111._14_2_;
        auVar115[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xe] - (0xff < sVar86);
        auVar115._8_8_ = 0;
        auVar40 = pshufb(auVar42,(undefined1  [16])aUVar20);
        auVar111 = pshufb(auVar115,(undefined1  [16])aUVar20);
        auVar46._0_12_ = auVar40._0_12_;
        auVar46._12_2_ = auVar40._6_2_;
        auVar46._14_2_ = auVar111._6_2_;
        auVar45._12_4_ = auVar46._12_4_;
        auVar45._0_10_ = auVar40._0_10_;
        auVar45._10_2_ = auVar111._4_2_;
        auVar44._10_6_ = auVar45._10_6_;
        auVar44._0_8_ = auVar40._0_8_;
        auVar44._8_2_ = auVar40._4_2_;
        auVar13._4_8_ = auVar44._8_8_;
        auVar13._2_2_ = auVar111._2_2_;
        auVar13._0_2_ = auVar40._2_2_;
        auVar43._0_4_ = CONCAT22(auVar111._0_2_,auVar40._0_2_);
        auVar43._4_12_ = auVar13;
        auVar40 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar24),auVar34);
        auVar40 = pmaddubsw(auVar40,in_XMM5);
        auVar111 = pshufb(*(undefined1 (*) [16])(pu1_ref + lVar26),auVar34);
        auVar111 = pmaddubsw(auVar111,auVar77);
        auVar80._0_2_ = auVar40._0_2_ + sVar47;
        auVar80._2_2_ = auVar40._2_2_ + sVar48;
        auVar80._4_2_ = auVar40._4_2_ + sVar49;
        auVar80._6_2_ = auVar40._6_2_ + sVar51;
        auVar80._8_2_ = auVar40._8_2_ + sVar52;
        auVar80._10_2_ = auVar40._10_2_ + sVar53;
        auVar80._12_2_ = auVar40._12_2_ + sVar109;
        auVar80._14_2_ = auVar40._14_2_ + sVar110;
        auVar116._0_2_ = auVar111._0_2_ + sVar47;
        auVar116._2_2_ = auVar111._2_2_ + sVar48;
        auVar116._4_2_ = auVar111._4_2_ + sVar49;
        auVar116._6_2_ = auVar111._6_2_ + sVar51;
        auVar116._8_2_ = auVar111._8_2_ + sVar52;
        auVar116._10_2_ = auVar111._10_2_ + sVar53;
        auVar116._12_2_ = auVar111._12_2_ + sVar109;
        auVar116._14_2_ = auVar111._14_2_ + sVar110;
        auVar40 = psraw(auVar80,5);
        auVar111 = psraw(auVar116,5);
        sVar86 = auVar40._0_2_;
        sVar87 = auVar40._2_2_;
        auVar81[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar40[2] - (0xff < sVar87);
        auVar81[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0] - (0xff < sVar86);
        sVar86 = auVar40._4_2_;
        auVar81[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[4] - (0xff < sVar86);
        sVar86 = auVar40._6_2_;
        auVar81[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[6] - (0xff < sVar86);
        sVar86 = auVar40._8_2_;
        auVar81[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[8] - (0xff < sVar86);
        sVar86 = auVar40._10_2_;
        auVar81[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[10] - (0xff < sVar86);
        sVar86 = auVar40._12_2_;
        auVar81[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xc] - (0xff < sVar86);
        sVar86 = auVar40._14_2_;
        auVar81[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar40[0xe] - (0xff < sVar86);
        auVar81._8_8_ = 0;
        sVar86 = auVar111._0_2_;
        sVar87 = auVar111._2_2_;
        auVar117[1] = (0 < sVar87) * (sVar87 < 0x100) * auVar111[2] - (0xff < sVar87);
        auVar117[0] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0] - (0xff < sVar86);
        sVar86 = auVar111._4_2_;
        auVar117[2] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[4] - (0xff < sVar86);
        sVar86 = auVar111._6_2_;
        auVar117[3] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[6] - (0xff < sVar86);
        sVar86 = auVar111._8_2_;
        auVar117[4] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[8] - (0xff < sVar86);
        sVar86 = auVar111._10_2_;
        auVar117[5] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[10] - (0xff < sVar86);
        sVar86 = auVar111._12_2_;
        auVar117[6] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xc] - (0xff < sVar86);
        sVar86 = auVar111._14_2_;
        auVar117[7] = (0 < sVar86) * (sVar86 < 0x100) * auVar111[0xe] - (0xff < sVar86);
        auVar117._8_8_ = 0;
        auVar40 = pshufb(auVar81,(undefined1  [16])aUVar20);
        auVar111 = pshufb(auVar117,(undefined1  [16])aUVar20);
        auVar84._0_12_ = auVar40._0_12_;
        auVar84._12_2_ = auVar40._6_2_;
        auVar84._14_2_ = auVar111._6_2_;
        auVar83._12_4_ = auVar84._12_4_;
        auVar83._0_10_ = auVar40._0_10_;
        auVar83._10_2_ = auVar111._4_2_;
        auVar82._10_6_ = auVar83._10_6_;
        auVar82._0_8_ = auVar40._0_8_;
        auVar82._8_2_ = auVar40._4_2_;
        auVar14._4_8_ = auVar82._8_8_;
        auVar14._2_2_ = auVar111._2_2_;
        auVar14._0_2_ = auVar40._2_2_;
        auVar118._0_8_ = auVar103._0_8_;
        auVar118._8_4_ = auVar11._0_4_;
        auVar118._12_4_ = auVar12._0_4_;
        auVar66._0_8_ = auVar43._0_8_;
        auVar66._8_4_ = auVar13._0_4_;
        auVar66._12_4_ = auVar14._0_4_;
        *(ulong *)pUVar22 = CONCAT44(CONCAT22(auVar100._0_2_,auVar60._0_2_),auVar103._0_4_);
        *(ulong *)(pUVar22 + 8) = CONCAT44(CONCAT22(auVar111._0_2_,auVar40._0_2_),auVar43._0_4_);
        *(long *)(pUVar22 + lVar21) = auVar118._8_8_;
        *(long *)(pUVar22 + lVar21 + 8) = auVar66._8_8_;
        pUVar1 = pUVar22 + lVar21 * 2;
        *(int *)pUVar1 = auVar104._8_4_;
        *(int *)(pUVar1 + 4) = auVar63._8_4_;
        *(int *)(pUVar1 + 8) = auVar44._8_4_;
        *(int *)(pUVar1 + 0xc) = auVar82._8_4_;
        *(undefined4 *)(pUVar22 + lVar21 * 3 + 8) = auVar105._12_4_;
        *(undefined4 *)(pUVar22 + lVar21 * 3 + 0xc) = auVar64._12_4_;
        *(undefined4 *)(pUVar22 + lVar21 * 3 + 0x10) = auVar45._12_4_;
        *(undefined4 *)(pUVar22 + lVar21 * 3 + 0x14) = auVar83._12_4_;
        uVar25 = uVar25 + 4;
        pUVar22 = pUVar22 + lVar21 * 4;
      } while (uVar25 < (uint)nt);
      uVar27 = uVar27 + 0x10;
      pu1_dst = pu1_dst + 0x10;
    } while (uVar27 < (uint)(nt * 2));
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_3_to_9_ssse3(UWORD8 *pu1_ref,
                                               WORD32 src_strd,
                                               UWORD8 *pu1_dst,
                                               WORD32 dst_strd,
                                               WORD32 nt,
                                               WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang;

    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, zero_8x16b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm1;
    UNUSED(src_strd);

    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY7[0]);
    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi16(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(1);

    zero_8x16b = _mm_set1_epi16(0);


    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(4);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storel_epi64((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storel_epi64((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 8)); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 8)); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 8)); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 8)); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 0)), src_temp8_8x16b);             /* row=0*/

                src_temp2_8x16b  = _mm_shuffle_epi32(src_temp8_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (1))), src_temp2_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (2))), src_temp7_8x16b);       /* row=2*/

                src_temp4_8x16b  = _mm_shuffle_epi32(src_temp7_8x16b, _MM_SHUFFLE(3, 2, 3, 2));
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * (3))), src_temp4_8x16b);       /* row=4*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        two_nt_4x32b = _mm_set1_epi16((4 * nt) - 2);

        for(col = 0; col < 2 * nt; col += 16)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            WORD8  ai1_fract_temp_val[16], ai1_src_temp_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract4_8x16b;
            __m128i fract5_8x16b, fract6_8x16b, fract7_8x16b, fract8_8x16b, src_values10;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* fract = pos & (31); */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            ref_main_idx_4x32b = _mm_srai_epi16(res_temp5_4x32b,  5);

            ref_main_idx_4x32b = _mm_add_epi16(ref_main_idx_4x32b,  ref_main_idx_4x32b);

            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, ref_main_idx_4x32b);

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            /*(32 - fract) */
            src_values10 = _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            _mm_storeu_si128((__m128i *)(ai1_fract_temp_val), fract_4x32b);
            _mm_storeu_si128((__m128i *)(ai1_src_temp_val),  src_values10);

            fract1_8x16b = _mm_set1_epi8(ai1_fract_temp_val[0]);  /* col=0*/
            fract2_8x16b = _mm_set1_epi8(ai1_fract_temp_val[2]);  /* col=1*/
            fract3_8x16b = _mm_set1_epi8(ai1_fract_temp_val[4]);  /* col=2*/
            fract4_8x16b = _mm_set1_epi8(ai1_fract_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_set1_epi8(ai1_src_temp_val[0]);  /* col=0*/
            temp2_8x16b = _mm_set1_epi8(ai1_src_temp_val[2]);  /* col=1*/
            temp3_8x16b = _mm_set1_epi8(ai1_src_temp_val[4]);  /* col=2*/
            temp4_8x16b = _mm_set1_epi8(ai1_src_temp_val[6]);  /* col=3*/

            temp1_8x16b = _mm_unpacklo_epi8(temp1_8x16b, fract1_8x16b);
            temp2_8x16b = _mm_unpacklo_epi8(temp2_8x16b, fract2_8x16b);
            temp3_8x16b = _mm_unpacklo_epi8(temp3_8x16b, fract3_8x16b);
            temp4_8x16b = _mm_unpacklo_epi8(temp4_8x16b, fract4_8x16b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            fract5_8x16b = _mm_set1_epi8(ai1_fract_temp_val[8]);  /* col=5*/
            fract6_8x16b = _mm_set1_epi8(ai1_fract_temp_val[10]);  /* col=6*/
            fract7_8x16b = _mm_set1_epi8(ai1_fract_temp_val[12]);  /* col=7*/
            fract8_8x16b = _mm_set1_epi8(ai1_fract_temp_val[14]);  /* col=8*/

            temp11_8x16b = _mm_set1_epi8(ai1_src_temp_val[8]);  /* col=0*/
            temp12_8x16b = _mm_set1_epi8(ai1_src_temp_val[10]);  /* col=1*/
            temp13_8x16b = _mm_set1_epi8(ai1_src_temp_val[12]);  /* col=2*/
            temp14_8x16b = _mm_set1_epi8(ai1_src_temp_val[14]);  /* col=3*/

            temp11_8x16b = _mm_unpacklo_epi8(temp11_8x16b, fract5_8x16b);
            temp12_8x16b = _mm_unpacklo_epi8(temp12_8x16b, fract6_8x16b);
            temp13_8x16b = _mm_unpacklo_epi8(temp13_8x16b, fract7_8x16b);
            temp14_8x16b = _mm_unpacklo_epi8(temp14_8x16b, fract8_8x16b);

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 4)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - row - (8 + row))); /* col=0*/
                src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - row - (8 + row))); /* col=1*/
                src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - row - (8 + row))); /* col=2*/
                src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - row - (8 + row))); /* col=3*/

                src_temp1_8x16b = _mm_srli_si128(src_temp5_8x16b, 2); /* col=0*/
                src_temp2_8x16b = _mm_srli_si128(src_temp6_8x16b, 2); /* col=1*/
                src_temp3_8x16b = _mm_srli_si128(src_temp7_8x16b, 2); /* col=2*/
                src_temp4_8x16b = _mm_srli_si128(src_temp8_8x16b, 2); /* col=3*/

                src_temp1_8x16b =  _mm_unpacklo_epi8(src_temp1_8x16b, src_temp5_8x16b); /* col=0*/
                src_temp2_8x16b =  _mm_unpacklo_epi8(src_temp2_8x16b, src_temp6_8x16b); /* col=1*/
                src_temp3_8x16b =  _mm_unpacklo_epi8(src_temp3_8x16b, src_temp7_8x16b); /* col=2*/
                src_temp4_8x16b =  _mm_unpacklo_epi8(src_temp4_8x16b, src_temp8_8x16b); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp15_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - row - row - 8)); /* col=5*/
                src_temp16_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - row - row - 8)); /* col=6*/
                src_temp17_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - row - row - 8)); /* col=7*/
                src_temp18_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - row - row - 8)); /* col=8*/

                src_temp11_8x16b = _mm_srli_si128(src_temp15_8x16b, 2); /* col=5*/
                src_temp12_8x16b = _mm_srli_si128(src_temp16_8x16b, 2); /* col=6*/
                src_temp13_8x16b = _mm_srli_si128(src_temp17_8x16b, 2); /* col=7*/
                src_temp14_8x16b = _mm_srli_si128(src_temp18_8x16b, 2); /* col=8*/

                src_temp11_8x16b =  _mm_unpacklo_epi8(src_temp11_8x16b, src_temp15_8x16b); /* col=0*/
                src_temp12_8x16b =  _mm_unpacklo_epi8(src_temp12_8x16b, src_temp16_8x16b); /* col=1*/
                src_temp13_8x16b =  _mm_unpacklo_epi8(src_temp13_8x16b, src_temp17_8x16b); /* col=2*/
                src_temp14_8x16b =  _mm_unpacklo_epi8(src_temp14_8x16b, src_temp18_8x16b); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, zero_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, zero_8x16b); /* col=1*/
                src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, zero_8x16b); /* col=2*/
                src_temp4_8x16b = _mm_packus_epi16(src_temp4_8x16b, zero_8x16b); /* col=3*/

                src_temp1_8x16b = _mm_shuffle_epi8(src_temp1_8x16b, sm1);
                src_temp2_8x16b = _mm_shuffle_epi8(src_temp2_8x16b, sm1);
                src_temp3_8x16b = _mm_shuffle_epi8(src_temp3_8x16b, sm1);
                src_temp4_8x16b = _mm_shuffle_epi8(src_temp4_8x16b, sm1);

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, zero_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, zero_8x16b); /* col=6*/
                src_temp13_8x16b = _mm_packus_epi16(src_temp13_8x16b, zero_8x16b); /* col=7*/
                src_temp14_8x16b = _mm_packus_epi16(src_temp14_8x16b, zero_8x16b); /* col=8*/

                src_temp11_8x16b = _mm_shuffle_epi8(src_temp11_8x16b, sm1);
                src_temp12_8x16b = _mm_shuffle_epi8(src_temp12_8x16b, sm1);
                src_temp13_8x16b = _mm_shuffle_epi8(src_temp13_8x16b, sm1);
                src_temp14_8x16b = _mm_shuffle_epi8(src_temp14_8x16b, sm1);

                src_temp5_8x16b = _mm_unpacklo_epi16(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpacklo_epi16(src_temp3_8x16b, src_temp4_8x16b);

                src_temp8_8x16b = _mm_unpacklo_epi32(src_temp5_8x16b, src_temp6_8x16b);
                src_temp7_8x16b = _mm_unpackhi_epi32(src_temp5_8x16b, src_temp6_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi16(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpacklo_epi16(src_temp13_8x16b, src_temp14_8x16b);

                src_temp18_8x16b = _mm_unpacklo_epi32(src_temp15_8x16b, src_temp16_8x16b);
                src_temp17_8x16b = _mm_unpackhi_epi32(src_temp15_8x16b, src_temp16_8x16b);

                src_temp11_8x16b = _mm_unpacklo_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp12_8x16b = _mm_unpackhi_epi64(src_temp8_8x16b, src_temp18_8x16b);
                src_temp13_8x16b = _mm_unpacklo_epi64(src_temp7_8x16b, src_temp17_8x16b);
                src_temp14_8x16b = _mm_unpackhi_epi64(src_temp7_8x16b, src_temp17_8x16b);

                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * row)),    src_temp11_8x16b);          /* row=0*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp12_8x16b);       /* row=1*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp13_8x16b);       /* row=2*/
                _mm_storeu_si128((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp14_8x16b);       /* row=4*/

            }
        }
    }
}